

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stringutil.cpp
# Opt level: O0

void __thiscall
StringUtil_StringToByteError_Test::~StringUtil_StringToByteError_Test
          (StringUtil_StringToByteError_Test *this)

{
  StringUtil_StringToByteError_Test *this_local;
  
  ~StringUtil_StringToByteError_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(StringUtil, StringToByteError) {
  try {
    std::string target("hello!");
    std::vector<uint8_t> bytes = StringUtil::StringToByte(target);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "hex to byte convert error.");
    return;
  }
  ASSERT_TRUE(false);
}